

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxu32 Systrcpy(char *zDest,sxu32 nDestLen,char *zSrc,sxu32 nLen)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  
  if (nLen == 0) {
    pcVar2 = zSrc;
    if (*zSrc != '\0') {
      pcVar3 = zSrc + 2;
      do {
        pcVar2 = pcVar3;
        if (pcVar2[-1] == '\0') {
          pcVar2 = pcVar2 + -1;
          goto LAB_0010f6a9;
        }
        if (*pcVar2 == '\0') goto LAB_0010f6a9;
        if (pcVar2[1] == '\0') {
          pcVar2 = pcVar2 + 1;
          goto LAB_0010f6a9;
        }
        pcVar3 = pcVar2 + 4;
      } while (pcVar2[2] != '\0');
      pcVar2 = pcVar2 + 2;
    }
LAB_0010f6a9:
    nLen = (int)pcVar2 - (int)zSrc;
  }
  pcVar2 = zDest;
  if ((nDestLen - 1 != 0) && (nLen != 0)) {
    pcVar3 = zDest + (nDestLen - 1);
    lVar5 = 0;
    do {
      pcVar2 = zDest + lVar5 + 1;
      zDest[lVar5] = zSrc[lVar5];
      if ((pcVar3 <= pcVar2) || (iVar4 = (int)lVar5, nLen - 1 == iVar4)) goto LAB_0010f749;
      pcVar2 = zDest + lVar5 + 2;
      zDest[lVar5 + 1] = zSrc[lVar5 + 1];
      if ((pcVar3 <= pcVar2) || (nLen - 2 == iVar4)) goto LAB_0010f749;
      pcVar2 = zDest + lVar5 + 3;
      zDest[lVar5 + 2] = zSrc[lVar5 + 2];
      if ((pcVar3 <= pcVar2) || (nLen - 3 == iVar4)) goto LAB_0010f749;
      lVar1 = lVar5 + 4;
      zDest[lVar5 + 3] = zSrc[lVar5 + 3];
      lVar5 = lVar5 + 4;
    } while ((zDest + lVar1 < pcVar3) && (nLen - 4 != iVar4));
    pcVar2 = zDest + lVar5;
  }
LAB_0010f749:
  *pcVar2 = '\0';
  return (int)pcVar2 - (int)zDest;
}

Assistant:

JX9_PRIVATE sxu32 Systrcpy(char *zDest, sxu32 nDestLen, const char *zSrc, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)zDest;
	unsigned char *zIn = (unsigned char *)zSrc;
	unsigned char *zEnd;
#if defined(UNTRUST)
	if( zSrc == (const char *)zDest ){
			return 0;
	}
#endif
	if( nLen <= 0 ){
		nLen = SyStrlen(zSrc);
	}
	zEnd = &zBuf[nDestLen - 1]; /* reserve a room for the null terminator */
	for(;;){
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
	}
	zBuf[0] = 0;
	return (sxu32)(zBuf-(unsigned char *)zDest);
}